

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O2

bool __thiscall QXmlUtils::isPublicID(QXmlUtils *this,QStringView candidate)

{
  uint uVar1;
  ushort uVar2;
  bool bVar3;
  long lVar4;
  
  for (lVar4 = 0; (long)this * 2 != lVar4; lVar4 = lVar4 + 2) {
    uVar2 = *(ushort *)(candidate.m_size + lVar4);
    bVar3 = QtMiscUtils::isAsciiLetterOrNumber((uint)uVar2);
    if ((!bVar3) &&
       (((uVar1 = (uint)uVar2 + L'\xfffffff6', 0x36 < uVar1 ||
         ((0x6b003feec00009U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) && (uVar2 != 0x5f)))) break;
  }
  return (long)this * 2 == lVar4;
}

Assistant:

bool QXmlUtils::isPublicID(QStringView candidate)
{
    for (QChar ch : candidate) {
        const ushort cp = ch.unicode();

        if (isAsciiLetterOrNumber(cp))
            continue;

        switch (cp)
        {
            /* Fallthrough all these. */
            case 0x20:
            case 0x0D:
            case 0x0A:
            case '-':
            case '\'':
            case '(':
            case ')':
            case '+':
            case ',':
            case '.':
            case '/':
            case ':':
            case '=':
            case '?':
            case ';':
            case '!':
            case '*':
            case '#':
            case '@':
            case '$':
            case '_':
            case '%':
                continue;
            default:
                return false;
        }
    }

    return true;
}